

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O2

lzham_compress_state_ptr lzham::lzham_lib_compress_init(lzham_compress_params *pParams)

{
  lzham_uint32 lVar1;
  lzham_uint32 lVar2;
  lzham_uint32 lVar3;
  lzham_uint32 lVar4;
  lzham_uint32 lVar5;
  lzham_compress_level lVar6;
  lzham_uint32 lVar7;
  uint uVar8;
  lzham_compress_state *plVar9;
  lzham_compress_status_t lVar10;
  int iVar11;
  lzham_compress_state *p;
  init_params local_40;
  
  if (pParams == (lzham_compress_params *)0x0) {
    return (lzham_compress_state_ptr)0x0;
  }
  if (pParams->m_struct_size != 0x1c) {
    return (lzham_compress_state_ptr)0x0;
  }
  if (pParams->m_dict_size_log2 - 0x1e < 0xfffffff1) {
    return (lzham_compress_state_ptr)0x0;
  }
  local_40.m_pTask_pool = (task_pool *)0x0;
  local_40.m_max_helper_threads = 0;
  local_40.m_compression_level = cCompressionLevelDefault;
  local_40.m_dict_size_log2 = 0x16;
  local_40.m_block_size = 0x80000;
  local_40.m_num_cachelines = 0;
  local_40.m_cacheline_size = 0;
  local_40.m_lzham_compress_flags = 0;
  lVar10 = create_init_params(&local_40,pParams);
  if (lVar10 != LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
    return (lzham_compress_state_ptr)0x0;
  }
  p = lzham_new<lzham::lzham_compress_state>();
  if (p == (lzham_compress_state *)0x0) {
    return (lzham_compress_state_ptr)0x0;
  }
  lVar4 = pParams->m_struct_size;
  lVar5 = pParams->m_dict_size_log2;
  lVar6 = pParams->m_level;
  lVar7 = pParams->m_max_helper_threads;
  lVar1 = pParams->m_cpucache_total_lines;
  lVar2 = pParams->m_cpucache_line_size;
  lVar3 = pParams->m_compress_flags;
  (p->m_params).m_max_helper_threads = pParams->m_max_helper_threads;
  (p->m_params).m_cpucache_total_lines = lVar1;
  (p->m_params).m_cpucache_line_size = lVar2;
  (p->m_params).m_compress_flags = lVar3;
  (p->m_params).m_struct_size = lVar4;
  (p->m_params).m_dict_size_log2 = lVar5;
  (p->m_params).m_level = lVar6;
  (p->m_params).m_max_helper_threads = lVar7;
  p->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
  p->m_pIn_buf = (uint8 *)0x0;
  p->m_pIn_buf_size = (size_t *)0x0;
  p->m_pOut_buf = (uint8 *)0x0;
  p->m_pOut_buf_size = (size_t *)0x0;
  *(undefined8 *)((long)&p->m_pOut_buf_size + 1) = 0;
  *(undefined8 *)((long)&p->m_comp_data_ofs + 1) = 0;
  uVar8 = local_40.m_max_helper_threads;
  plVar9 = (lzham_compress_state *)local_40.m_pTask_pool;
  if (local_40.m_max_helper_threads != 0) {
    iVar11 = task_pool::init(&p->m_tp,(EVP_PKEY_CTX *)(local_40._8_8_ & 0xffffffff));
    if ((char)iVar11 == '\0') goto LAB_0010a1d4;
    plVar9 = p;
    if ((p->m_tp).m_num_threads < uVar8) {
      local_40._8_8_ = local_40._8_8_ & 0xffffffff00000000;
      plVar9 = (lzham_compress_state *)local_40.m_pTask_pool;
    }
  }
  local_40.m_pTask_pool = &plVar9->m_tp;
  iVar11 = lzcompressor::init(&p->m_compressor,(EVP_PKEY_CTX *)&local_40);
  if ((char)iVar11 != '\0') {
    return p;
  }
LAB_0010a1d4:
  lzham_delete<lzham::lzham_compress_state>(p);
  return (lzham_compress_state_ptr)0x0;
}

Assistant:

lzham_compress_state_ptr lzham_lib_compress_init(const lzham_compress_params *pParams)
   {
      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_compress_params)))   
         return NULL;

      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
         return NULL;
      
      lzcompressor::init_params params;
      lzham_compress_status_t status = create_init_params(params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
         return NULL;
      
      lzham_compress_state *pState = lzham_new<lzham_compress_state>();
      if (!pState)
         return NULL;

      pState->m_params = *pParams;
      
      pState->m_pIn_buf = NULL;
      pState->m_pIn_buf_size = NULL;
      pState->m_pOut_buf = NULL;
      pState->m_pOut_buf_size = NULL;
      pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
      pState->m_comp_data_ofs = 0;
      pState->m_flushed_compressor = false;
      
      if (params.m_max_helper_threads)
      {
         if (!pState->m_tp.init(params.m_max_helper_threads))
         {
            lzham_delete(pState);
            return NULL;
         }
         if (pState->m_tp.get_num_threads() >= params.m_max_helper_threads)
         {
            params.m_pTask_pool = &pState->m_tp;
         }
         else
         {
            params.m_max_helper_threads = 0;
         }
      }
                  
      if (!pState->m_compressor.init(params))
      {
         lzham_delete(pState);
         return NULL;
      }
      
      return pState;
   }